

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::anon_unknown_20::jacobiRotateRight<float>
               (Matrix44<float> *A,int j,int k,float c,float s)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    fVar1 = *(float *)((long)A->x[0] + lVar3 + (ulong)(uint)j * 4);
    fVar2 = *(float *)((long)A->x[0] + lVar3 + (ulong)(uint)k * 4);
    *(float *)((long)A->x[0] + lVar3 + (ulong)(uint)j * 4) = c * fVar1 - fVar2 * s;
    *(float *)((long)A->x[0] + lVar3 + (ulong)(uint)k * 4) = fVar1 * s + fVar2 * c;
  }
  return;
}

Assistant:

void
jacobiRotateRight (
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    const int                              j,
    const int                              k,
    const T                                c,
    const T                                s)
{
    for (int i = 0; i < 4; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j]      = c * tau1 - s * tau2;
        A[i][k]      = s * tau1 + c * tau2;
    }
}